

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  char *pcVar3;
  size_t data_size;
  ImGuiWindowSettings *pIVar4;
  
  pIVar1 = GImGui;
  if ((GImGui->IO).ConfigDebugIniSettings == false) {
    pcVar3 = strstr(name,"###");
    if (pcVar3 != (char *)0x0) {
      name = pcVar3;
    }
  }
  data_size = strlen(name);
  pIVar4 = ImChunkStream<ImGuiWindowSettings>::alloc_chunk
                     (&pIVar1->SettingsWindows,data_size + 0x11);
  pIVar4->ID = 0;
  (pIVar4->Pos).x = 0;
  (pIVar4->Pos).y = 0;
  (pIVar4->Size).x = 0;
  (pIVar4->Size).y = 0;
  pIVar4->Collapsed = false;
  pIVar4->IsChild = false;
  pIVar4->WantApply = false;
  pIVar4->WantDelete = false;
  IVar2 = ImHashStr(name,data_size,0);
  pIVar4->ID = IVar2;
  memcpy(pIVar4 + 1,name,data_size + 1);
  return pIVar4;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;

    if (g.IO.ConfigDebugIniSettings == false)
    {
        // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
        // Preserve the full string when ConfigDebugVerboseIniSettings is set to make .ini inspection easier.
        if (const char* p = strstr(name, "###"))
            name = p;
    }
    const size_t name_len = strlen(name);

    // Allocate chunk
    const size_t chunk_size = sizeof(ImGuiWindowSettings) + name_len + 1;
    ImGuiWindowSettings* settings = g.SettingsWindows.alloc_chunk(chunk_size);
    IM_PLACEMENT_NEW(settings) ImGuiWindowSettings();
    settings->ID = ImHashStr(name, name_len);
    memcpy(settings->GetName(), name, name_len + 1);   // Store with zero terminator

    return settings;
}